

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

void Fossilize::DestroyDevice(VkDevice device,VkAllocationCallbacks *pAllocator)

{
  ulong uVar1;
  long *plVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  __hash_code __code;
  _Node_iterator_base<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_false>
  __it;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)globalLock);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = *(ulong *)device;
  plVar4 = *(long **)(deviceData + (uVar1 % DAT_00177748) * 8);
  for (plVar5 = (long *)*plVar4; plVar5[1] != uVar1; plVar5 = (long *)*plVar5) {
    plVar4 = plVar5;
  }
  (**(code **)(*(long *)(*(long *)(*plVar4 + 0x10) + 0x18) + 8))(device);
  plVar4 = *(long **)(deviceData + (uVar1 % DAT_00177748) * 8);
  plVar5 = (long *)0x0;
  if ((plVar4 != (long *)0x0) &&
     (plVar2 = (long *)*plVar4, plVar5 = plVar4, ((long *)*plVar4)[1] != uVar1)) {
    while (plVar4 = plVar2, plVar2 = (long *)*plVar4, plVar2 != (long *)0x0) {
      plVar5 = (long *)0x0;
      if (((ulong)plVar2[1] % DAT_00177748 != uVar1 % DAT_00177748) ||
         (plVar5 = plVar4, plVar2[1] == uVar1)) goto LAB_00114bf5;
    }
    plVar5 = (long *)0x0;
  }
LAB_00114bf5:
  if (plVar5 == (long *)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)*plVar5;
  }
  std::
  _Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase((_Hashtable<void_*,_std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>,_std::allocator<std::pair<void_*const,_std::unique_ptr<Fossilize::Device,_std::default_delete<Fossilize::Device>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)&deviceData,(const_iterator)__it._M_cur);
  pthread_mutex_unlock((pthread_mutex_t *)globalLock);
  return;
}

Assistant:

static VKAPI_ATTR void VKAPI_CALL DestroyDevice(VkDevice device, const VkAllocationCallbacks *pAllocator)
{
	lock_guard<mutex> holder{ globalLock };

	void *key = getDispatchKey(device);
	auto *layer = getLayerData(key, deviceData);

	layer->getTable()->DestroyDevice(device, pAllocator);
	destroyLayerData(key, deviceData);
}